

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::BinaryExpression>
          (PropagationVisitor *this,BinaryExpression *expr)

{
  bool bVar1;
  byte bVar2;
  Type *in_RSI;
  ASTContext *in_RDI;
  SourceRange in_stack_00000000;
  ConversionKind in_stack_00000014;
  Type *in_stack_00000018;
  ASTContext *in_stack_00000020;
  BinaryExpression *in_stack_00000028;
  Expression *result;
  bool needConversion;
  Type *in_stack_ffffffffffffff90;
  Type *local_48;
  Expression *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  Type *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  ConversionKind in_stack_ffffffffffffffe4;
  
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff90);
  if (bVar1) {
    return (Expression *)in_RSI;
  }
  bVar1 = Type::isError((Type *)0x708825);
  if (bVar1) {
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
              ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffffe0,
               (Type **)&stack0xffffffffffffffd8);
    (in_RSI->super_Symbol).name._M_len =
         (size_t)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    return (Expression *)in_RSI;
  }
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x708881);
  bVar1 = Type::isEquivalent(in_RSI,(Type *)CONCAT44(in_stack_ffffffffffffffe4,
                                                     in_stack_ffffffffffffffe0));
  bVar2 = (bVar1 ^ 0xffU) & 1;
  bVar1 = Type::isFloating((Type *)0x7088a8);
  local_48 = in_RSI;
  if (bVar1) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x7088bc);
    bVar1 = Type::isFloating((Type *)0x7088c4);
    local_48 = in_RSI;
    if (!bVar1) goto LAB_007088c8;
  }
  else {
LAB_007088c8:
    bVar1 = Type::isIntegral(in_stack_ffffffffffffff90);
    if (bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x7088ea)
      ;
      bVar1 = Type::isIntegral(in_stack_ffffffffffffff90);
      if (bVar1) goto LAB_00708912;
    }
    bVar1 = Type::isString((Type *)0x708904);
    if ((!bVar1) && ((local_48->super_Symbol).kind != UntypedType)) goto LAB_00708978;
  }
LAB_00708912:
  if ((bVar2 & 1) == 0) {
    updateRange((PropagationVisitor *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffc8);
  }
  bVar1 = BinaryExpression::propagateType
                    (in_stack_00000028,in_stack_00000020,in_stack_00000018,_result,in_stack_00000014
                    );
  if (bVar1) {
    bVar2 = 0;
    (local_48->super_Symbol).name._M_str = (char *)0x0;
  }
LAB_00708978:
  if ((bVar2 & 1) != 0) {
    local_48 = (Type *)ConversionExpression::makeImplicit
                                 (in_RDI,local_48,in_stack_ffffffffffffffe4,
                                  (Expression *)in_stack_ffffffffffffffd8,
                                  (Expression *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
                                  in_stack_00000000);
  }
  return (Expression *)local_48;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (requires { expr.propagateType(context, newType, opRange, conversionKind); }) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::ValueRange) {

                if (!needConversion) {
                    // If we don't need a conversion here we still need to call propagateType as
                    // one of our child expressions may still need conversion. However, we shouldn't
                    // pass along our given opRange since we didn't need the conversion here, so our
                    // parent operator isn't relevant. We should try to refigure an opRange for our
                    // most immediate parent expression instead.
                    updateRange(expr);
                }

                if (expr.propagateType(context, newType, opRange, conversionKind)) {
                    // We propagated the type successfully so we don't need a conversion.
                    // We should however clear out any constant value that may have been
                    // stored here, since it may no longer be valid given the new type.
                    needConversion = false;
                    expr.constant = nullptr;
                }
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            result = &ConversionExpression::makeImplicit(context, newType, conversionKind, expr,
                                                         parentExpr, opRange);
        }

        return *result;
    }